

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void ma_device_sink_name_callback
               (ma_pa_context *pPulseContext,ma_pa_sink_info *pInfo,int endOfList,void *pUserData)

{
  if (0 < endOfList) {
    return;
  }
  if (pUserData != (void *)0x0) {
    ma_strncpy_s((char *)((long)pUserData + 0x1c0),0x100,pInfo->description,0xffffffffffffffff);
    return;
  }
  __assert_fail("pDevice != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x4bd6,
                "void ma_device_sink_name_callback(ma_pa_context *, const ma_pa_sink_info *, int, void *)"
               );
}

Assistant:

static void ma_device_sink_name_callback(ma_pa_context* pPulseContext, const ma_pa_sink_info* pInfo, int endOfList, void* pUserData)
{
    ma_device* pDevice;

    if (endOfList > 0) {
        return;
    }

    pDevice = (ma_device*)pUserData;
    MA_ASSERT(pDevice != NULL);

    ma_strncpy_s(pDevice->playback.name, sizeof(pDevice->playback.name), pInfo->description, (size_t)-1);

    (void)pPulseContext; /* Unused. */
}